

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1cmap.c
# Opt level: O2

FT_UInt32 t1_cmap_std_char_next(T1_CMapStd cmap,FT_UInt32 *pchar_code)

{
  FT_UInt FVar1;
  uint char_code;
  
  char_code = *pchar_code;
  do {
    char_code = char_code + 1;
    if (0xff < char_code) {
      FVar1 = 0;
      char_code = 0;
      break;
    }
    FVar1 = t1_cmap_std_char_index(cmap,char_code);
  } while (FVar1 == 0);
  *pchar_code = char_code;
  return FVar1;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  t1_cmap_std_char_next( T1_CMapStd   cmap,
                         FT_UInt32   *pchar_code )
  {
    FT_UInt    result    = 0;
    FT_UInt32  char_code = *pchar_code + 1;


    while ( char_code < 256 )
    {
      result = t1_cmap_std_char_index( cmap, char_code );
      if ( result != 0 )
        goto Exit;

      char_code++;
    }
    char_code = 0;

  Exit:
    *pchar_code = char_code;
    return result;
  }